

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jointObservations)

{
  Index IVar1;
  const_reference pvVar2;
  const_reference indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  undefined4 in_ESI;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  uVar3 = in_ESI;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (in_RDI,in_stack_ffffffffffffffc8);
  IVar1 = Globals::CastLIndexToIndex(*pvVar2);
  indices = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,0);
  GetNrJointObservations((PlanningUnitMADPDiscrete *)0x9d686f);
  IVar1 = ComputeHistoryIndex((PlanningUnitMADPDiscrete *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
                              (Index)((ulong)in_RDX >> 0x20),(Index)in_RDX,indices,
                              CONCAT44(IVar1,in_ESI));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        Index t, const vector<Index>& jointObservations) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJOHIforT.at(t)), 
                &jointObservations[0],
                GetNrJointObservations()
                )
          );    
/*
    size_t this_JOHI=_m_firstJOHIforT.at(t);
    size_t nrJO = GetNrJointObservations();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJO, (double)(exponent));
        this_JOHI += jointObservations.at(ts) * b;
    }
    return(this_JOHI);*/
}